

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::base::UnixSocketRaw::SetBlocking(UnixSocketRaw *this,bool is_blocking)

{
  uint __fd;
  uint uVar1;
  int iVar2;
  int *piVar3;
  
  uVar1 = fcntl((this->fd_).t_,3,0);
  __fd = (this->fd_).t_;
  piVar3 = (int *)(ulong)__fd;
  iVar2 = fcntl(__fd,4,(ulong)((uint)!is_blocking << 0xb | uVar1 & 0xfffff7ff));
  if (iVar2 == 0) {
    return;
  }
  SetBlocking();
  fcntl(*piVar3,3,0);
  return;
}

Assistant:

void UnixSocketRaw::SetBlocking(bool is_blocking) {
  PERFETTO_DCHECK(fd_);
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  unsigned long flag = is_blocking ? 0 : 1;  // FIONBIO has reverse logic.
  if (is_blocking) {
    // When switching between non-blocking -> blocking mode, we need to reset
    // the event handle registration, otherwise the call will fail.
    PERFETTO_CHECK(WSAEventSelect(*fd_, *event_handle_, 0) == 0);
  }
  PERFETTO_CHECK(ioctlsocket(*fd_, static_cast<long>(FIONBIO), &flag) == 0);
  if (!is_blocking) {
    PERFETTO_CHECK(
        WSAEventSelect(*fd_, *event_handle_,
                       FD_ACCEPT | FD_CONNECT | FD_READ | FD_CLOSE) == 0);
  }
#else
  int flags = fcntl(*fd_, F_GETFL, 0);
  if (!is_blocking) {
    flags |= O_NONBLOCK;
  } else {
    flags &= ~static_cast<int>(O_NONBLOCK);
  }
  int fcntl_res = fcntl(*fd_, F_SETFL, flags);
  PERFETTO_CHECK(fcntl_res == 0);
#endif
}